

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferStream.hh
# Opt level: O2

void __thiscall avro::ostream::~ostream(ostream *this)

{
  ~ostream((ostream *)
           ((long)&(this->super_ostream)._vptr_basic_ostream +
           (long)(this->super_ostream)._vptr_basic_ostream[-3]));
  return;
}

Assistant:

class AVRO_DECL ostream : public std::ostream {

  public:

    /// Default constructor, creates a new OutputBuffer.
    ostream() : 
        std::ostream(&obuf_) 
    { }

    /// Output to a specific buffer.
    ostream(OutputBuffer &buf) : 
        std::ostream(&obuf_),
        obuf_(buf)
    { }

    /// Return the output buffer created by the write operations to this ostream.
    const OutputBuffer &getBuffer() const {
        return obuf_.getBuffer();
    }

  protected:

    ostreambuf obuf_;
}